

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ClockingItemSyntax::ClockingItemSyntax
          (ClockingItemSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          ClockingDirectionSyntax *direction,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  AttributeSpecSyntax *pAVar4;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *__range2;
  undefined8 uVar5;
  iterator __begin2;
  
  uVar5 = semi._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClockingItem,attributes);
  (this->direction).ptr = direction;
  uVar3 = *(undefined4 *)&(decls->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (decls->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.kind =
       (decls->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->decls).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (decls->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->decls).super_SyntaxListBase.childCount = (decls->super_SyntaxListBase).childCount;
  (this->decls).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00596460;
  sVar1 = (decls->elements)._M_extent._M_extent_value;
  (this->decls).elements._M_ptr = (decls->elements)._M_ptr;
  (this->decls).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = (short)uVar5;
  (this->semi).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->semi).info = semi.info;
  (direction->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->decls).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __begin2.index = 0;
  sVar1 = (this->decls).elements._M_extent._M_extent_value;
  __begin2.list = &this->decls;
  for (; (__begin2.list != &this->decls || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    pAVar4 = SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::
             iterator_base<slang::syntax::AttributeSpecSyntax_*>::dereference(&__begin2);
    (pAVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClockingItemSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, ClockingDirectionSyntax& direction, const SeparatedSyntaxList<AttributeSpecSyntax>& decls, Token semi) :
        MemberSyntax(SyntaxKind::ClockingItem, attributes), direction(&direction), decls(decls), semi(semi) {
        this->direction->parent = this;
        this->decls.parent = this;
        for (auto child : this->decls)
            child->parent = this;
    }